

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BasicReporter::EndTestCase
          (BasicReporter *this,TestCaseInfo *testInfo,Totals *totals,string *stdOut,string *stdErr)

{
  ostream *poVar1;
  allocator<char> local_49;
  string local_48;
  
  if (stdOut->_M_string_length != 0) {
    startSpansLazily(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"stdout",&local_49);
    streamVariableLengthText(this,&local_48,stdOut);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if (stdErr->_M_string_length != 0) {
    startSpansLazily(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"stderr",&local_49);
    streamVariableLengthText(this,&local_48,stdErr);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((this->m_testSpan).emitted == true) {
    poVar1 = std::operator<<((this->m_config).stream,"[Finished: \'");
    poVar1 = std::operator<<(poVar1,(string *)&testInfo->m_name);
    std::operator<<(poVar1,"\' ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"All ",&local_49);
    ReportCounts(this,totals,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    poVar1 = std::operator<<((this->m_config).stream,"]");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

virtual void EndTestCase(   const TestCaseInfo& testInfo,
                                    const Totals& totals,
                                    const std::string& stdOut,
                                    const std::string& stdErr ) {
            if( !stdOut.empty() ) {
                startSpansLazily();
                streamVariableLengthText( "stdout", stdOut );
            }

            if( !stdErr.empty() ) {
                startSpansLazily();
                streamVariableLengthText( "stderr", stdErr );
            }

            if( m_testSpan.emitted ) {
                m_config.stream << "[Finished: '" << testInfo.getName() << "' ";
                ReportCounts( totals );
                m_config.stream << "]" << std::endl;
            }
        }